

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

ssize_t __thiscall
xmrig::SelfSelectClient::send(SelfSelectClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  String *pSVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  socklen_t __len;
  int __noclose;
  int __noclose_00;
  int __noclose_01;
  uint __nochdir;
  undefined4 in_register_00000084;
  size_t size;
  HttpClient *client;
  String *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  HttpClient *this_00;
  String *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 uVar6;
  HttpsClient *in_stack_ffffffffffffff80;
  IHttpListener *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar7;
  char *in_stack_ffffffffffffff98;
  int method;
  HttpClient *in_stack_ffffffffffffffa0;
  HttpClient *local_30;
  
  method = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  size = CONCAT44(in_register_00000084,__flags);
  iVar4 = __fd;
  iVar3 = (*(this->super_IClient)._vptr_IClient[10])();
  iVar4 = Pool::daemon((Pool *)CONCAT44(extraout_var,iVar3),iVar4,__noclose);
  bVar1 = Url::isTLS((Url *)CONCAT44(extraout_var_00,iVar4));
  if (bVar1) {
    local_30 = (HttpClient *)operator_new(0x988);
    uVar7 = 1;
    String::String(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __len = (int)this + 0x10;
    String::String((String *)&stack0xffffffffffffff98);
    HttpsClient::HttpsClient
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(String *)this,
               (IHttpListener *)CONCAT44(__fd,in_stack_ffffffffffffff68),(char *)local_30,size,
               (String *)CONCAT17(uVar7,in_stack_ffffffffffffff90));
    String::~String(in_stack_ffffffffffffff10);
    String::~String(in_stack_ffffffffffffff10);
  }
  else {
    local_30 = (HttpClient *)operator_new(0x108);
    uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffff7c);
    String::String(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __len = (int)this + 0x10;
    HttpClient::HttpClient
              (in_stack_ffffffffffffffa0,method,
               (String *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
               CONCAT44(uVar6,in_stack_ffffffffffffff78));
    String::~String(in_stack_ffffffffffffff10);
  }
  this_00 = local_30;
  bVar1 = isQuiet(this);
  __nochdir = (uint)bVar1;
  HttpClient::setQuiet(this_00,bVar1);
  iVar4 = (*(this->super_IClient)._vptr_IClient[10])();
  iVar4 = Pool::daemon((Pool *)CONCAT44(extraout_var_01,iVar4),__nochdir,__noclose_00);
  pSVar5 = Url::host((Url *)CONCAT44(extraout_var_02,iVar4));
  iVar4 = (*(this->super_IClient)._vptr_IClient[10])();
  iVar4 = Pool::daemon((Pool *)CONCAT44(extraout_var_03,iVar4),__nochdir,__noclose_01);
  uVar2 = Url::port((Url *)CONCAT44(extraout_var_04,iVar4));
  iVar4 = HttpClient::connect(local_30,(int)pSVar5,(sockaddr *)(ulong)uVar2,__len);
  return CONCAT44(extraout_var_05,iVar4);
}

Assistant:

void xmrig::SelfSelectClient::send(int method, const char *url, const char *data, size_t size)
{
    LOG_DEBUG("[%s] " MAGENTA_BOLD("\"%s %s\"") BLACK_BOLD_S " send (%zu bytes): \"%.*s\"",
              pool().daemon().url().data(),
              http_method_str(static_cast<http_method>(method)),
              url,
              size,
              static_cast<int>(size),
              data);

    HttpClient *client;
#   ifdef XMRIG_FEATURE_TLS
    if (pool().daemon().isTLS()) {
        client = new HttpsClient(method, url, this, data, size, String());
    }
    else
#   endif
    {
        client = new HttpClient(method, url, this, data, size);
    }

    client->setQuiet(isQuiet());
    client->connect(pool().daemon().host(), pool().daemon().port());
}